

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

void __thiscall Thread::~Thread(Thread *this)

{
  CountDownLatch *in_RDI;
  
  if (((undefined1  [112])((undefined1  [112])*in_RDI & (undefined1  [112])0x1) !=
       (undefined1  [112])0x0) && ((in_RDI->field_0x1 & 1) == 0)) {
    pthread_detach((in_RDI->mutex_).mutex.__align);
  }
  CountDownLatch::~CountDownLatch(in_RDI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::function<void_()>::~function((function<void_()> *)0x12192b);
  return;
}

Assistant:

Thread::~Thread(){
    if(started_&&!joined_) pthread_detach(pthreadId_);
}